

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSphericalHarmonic.cpp
# Opt level: O0

RealType __thiscall
OpenMD::RealSphericalHarmonic::LegendreP(RealSphericalHarmonic *this,int l,int m,RealType x)

{
  uint in_EDX;
  uint in_ESI;
  double in_XMM0_Qa;
  double dVar1;
  int ll;
  RealType pll;
  RealType pmmp1;
  int i;
  RealType f;
  RealType h;
  RealType pmm;
  int local_54;
  double local_50;
  double local_48;
  int local_3c;
  double local_38;
  double local_28;
  double local_8;
  
  if ((((int)in_EDX < 0) || ((int)in_ESI < (int)in_EDX)) || (1.0 < ABS(in_XMM0_Qa))) {
    printf("LegendreP got a bad argument: l = %d\tm = %d\tx = %lf\n",in_XMM0_Qa,(ulong)in_ESI,
           (ulong)in_EDX);
    local_8 = std::numeric_limits<double>::quiet_NaN();
  }
  else {
    local_28 = 1.0;
    if (0 < (int)in_EDX) {
      dVar1 = sqrt((1.0 - in_XMM0_Qa) * (in_XMM0_Qa + 1.0));
      local_38 = 1.0;
      for (local_3c = 1; local_3c <= (int)in_EDX; local_3c = local_3c + 1) {
        local_28 = -local_38 * dVar1 * local_28;
        local_38 = local_38 + 2.0;
      }
    }
    if (in_ESI == in_EDX) {
      local_8 = local_28;
    }
    else {
      local_48 = in_XMM0_Qa * (double)(int)(in_EDX * 2 + 1) * local_28;
      local_8 = local_48;
      if (in_ESI != in_EDX + 1) {
        local_50 = 0.0;
        for (local_54 = in_EDX + 2; local_54 <= (int)in_ESI; local_54 = local_54 + 1) {
          local_50 = (in_XMM0_Qa * (double)(local_54 * 2 + -1) * local_48 +
                     -((double)(int)(local_54 + in_EDX + -1) * local_28)) /
                     (double)(int)(local_54 - in_EDX);
          local_28 = local_48;
          local_48 = local_50;
        }
        local_8 = local_50;
      }
    }
  }
  return local_8;
}

Assistant:

RealType RealSphericalHarmonic::LegendreP(int l, int m, RealType x) {
  // check parameters
  if (m < 0 || m > l || fabs(x) > 1.0) {
    printf("LegendreP got a bad argument: l = %d\tm = %d\tx = %lf\n", l, m, x);
    //    return NAN;
    return std::numeric_limits<RealType>::quiet_NaN();
  }

  RealType pmm = 1.0;
  if (m > 0) {
    RealType h = sqrt((1.0 - x) * (1.0 + x)), f = 1.0;
    for (int i = 1; i <= m; i++) {
      pmm *= -f * h;
      f += 2.0;
    }
  }
  if (l == m)
    return pmm;
  else {
    RealType pmmp1 = x * (2 * m + 1) * pmm;
    if (l == (m + 1))
      return pmmp1;
    else {
      RealType pll = 0.0;
      for (int ll = m + 2; ll <= l; ll++) {
        pll   = (x * (2 * ll - 1) * pmmp1 - (ll + m - 1) * pmm) / (ll - m);
        pmm   = pmmp1;
        pmmp1 = pll;
      }
      return pll;
    }
  }
}